

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::OptIsInvariant
          (GlobOpt *this,Opnd *src,BasicBlock *block,Loop *loop,Value *srcVal,bool isNotTypeSpecConv
          ,bool allowNonPrimitives)

{
  bool bVar1;
  OpndKind OVar2;
  RegOpnd *pRVar3;
  SymOpnd *pSVar4;
  PropertySymOpnd *this_00;
  HelperCallOpnd *pHVar5;
  StackSym *local_48;
  Sym *sym;
  bool allowNonPrimitives_local;
  bool isNotTypeSpecConv_local;
  Value *srcVal_local;
  Loop *loop_local;
  BasicBlock *block_local;
  Opnd *src_local;
  GlobOpt *this_local;
  
  bVar1 = Loop::CanHoistInvariants(loop);
  if (!bVar1) {
    return false;
  }
  OVar2 = IR::Opnd::GetKind(src);
  switch(OVar2) {
  case OpndKindIntConst:
  case OpndKindFloatConst:
  case OpndKindAddr:
    this_local._7_1_ = true;
    break;
  default:
    this_local._7_1_ = false;
    break;
  case OpndKindHelperCall:
    pHVar5 = IR::Opnd::AsHelperCallOpnd(src);
    this_local._7_1_ = HelperMethodAttributes::IsInVariant(pHVar5->m_fnHelper);
    break;
  case OpndKindSym:
    pSVar4 = IR::Opnd::AsSymOpnd(src);
    local_48 = (StackSym *)pSVar4->m_sym;
    pSVar4 = IR::Opnd::AsSymOpnd(src);
    bVar1 = IR::SymOpnd::IsPropertySymOpnd(pSVar4);
    if (bVar1) {
      pSVar4 = IR::Opnd::AsSymOpnd(src);
      this_00 = IR::Opnd::AsPropertySymOpnd(&pSVar4->super_Opnd);
      bVar1 = IR::PropertySymOpnd::IsTypeChecked(this_00);
      if (bVar1) {
        return false;
      }
    }
    goto LAB_00580ebd;
  case OpndKindReg:
    pRVar3 = IR::Opnd::AsRegOpnd(src);
    local_48 = pRVar3->m_sym;
LAB_00580ebd:
    this_local._7_1_ =
         OptIsInvariant(this,&local_48->super_Sym,block,loop,srcVal,isNotTypeSpecConv,
                        allowNonPrimitives,(Value **)0x0);
  }
  return this_local._7_1_;
}

Assistant:

bool
GlobOpt::OptIsInvariant(IR::Opnd *src, BasicBlock *block, Loop *loop, Value *srcVal, bool isNotTypeSpecConv, bool allowNonPrimitives)
{
    if(!loop->CanHoistInvariants())
    {
        return false;
    }

    Sym *sym;

    switch(src->GetKind())
    {
    case IR::OpndKindAddr:
    case IR::OpndKindFloatConst:
    case IR::OpndKindIntConst:
        return true;

    case IR::OpndKindReg:
        sym = src->AsRegOpnd()->m_sym;
        break;

    case IR::OpndKindSym:
        sym = src->AsSymOpnd()->m_sym;
        if (src->AsSymOpnd()->IsPropertySymOpnd())
        {
            if (src->AsSymOpnd()->AsPropertySymOpnd()->IsTypeChecked())
            {
                // We do not handle hoisting these yet.  We might be hoisting this across the instr with the type check protecting this one.
                // And somehow, the dead-store pass now removes the type check on that instr later on...
                // For CheckFixedFld, there is no benefit hoisting these if they don't have a type check as they won't generate code.
                return false;
            }
        }

        break;

    case IR::OpndKindHelperCall:
        // Helper calls, like the private slot getter, can be invariant.
        // Consider moving more math builtin to invariant?
        return HelperMethodAttributes::IsInVariant(src->AsHelperCallOpnd()->m_fnHelper);

    default:
        return false;
    }
    return OptIsInvariant(sym, block, loop, srcVal, isNotTypeSpecConv, allowNonPrimitives);
}